

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_avx2.c
# Opt level: O0

__m256i * compute_directions_avx2(__m256i *lines,int32_t *cost_frist_8x8,int32_t *cost_second_8x8)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  __m256i *in_RDX;
  longlong *in_RSI;
  undefined1 (*in_RDI) [32];
  longlong lVar5;
  longlong lVar12;
  longlong lVar13;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  longlong lVar14;
  __m256i const_reg_4;
  __m256i const_reg_3;
  __m256i const_reg_2;
  __m256i const_reg_1;
  __m256i tmp;
  __m256i partial6;
  __m256i partial7b;
  __m256i partial7a;
  __m256i partial5b;
  __m256i partial5a;
  __m256i partial4b;
  __m256i partial4a;
  __m256i *in_stack_fffffffffffff3b8;
  __m256i *const2;
  __m256i *in_stack_fffffffffffff3c0;
  __m256i *const1;
  __m256i *partialb;
  __m256i *in_stack_fffffffffffff3d0;
  longlong local_c20;
  longlong lStack_c18;
  longlong lStack_c10;
  longlong lStack_c08;
  longlong local_c00;
  longlong lStack_bf8;
  longlong lStack_bf0;
  __m256i *x3;
  __m256i *x2;
  __m256i *x1;
  __m256i *x0;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  __m256i local_b00;
  undefined1 local_ae0 [32];
  __m256i local_ac0;
  __m256i *local_a98;
  longlong *local_a90;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9e0 [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0 [32];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined1 local_960 [32];
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined1 local_920 [32];
  longlong local_900;
  longlong lStack_8f8;
  longlong lStack_8f0;
  longlong lStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  longlong local_880;
  longlong lStack_878;
  longlong lStack_870;
  longlong lStack_868;
  undefined1 local_860 [32];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined1 local_820 [32];
  longlong local_800;
  longlong lStack_7f8;
  longlong lStack_7f0;
  longlong lStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [32];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_760 [32];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_720 [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  longlong local_6c0;
  longlong lStack_6b8;
  longlong lStack_6b0;
  longlong lStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_660 [32];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  longlong local_600;
  longlong lStack_5f8;
  longlong lStack_5f0;
  longlong lStack_5e8;
  undefined1 local_5e0 [32];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  longlong local_580;
  longlong lStack_578;
  longlong lStack_570;
  longlong lStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  longlong local_440;
  longlong lStack_438;
  longlong lStack_430;
  longlong lStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  longlong local_380;
  longlong lStack_378;
  longlong lStack_370;
  longlong lStack_368;
  undefined1 local_360 [32];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  longlong local_300;
  longlong lStack_2f8;
  longlong lStack_2f0;
  longlong lStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  longlong local_240;
  longlong lStack_238;
  longlong lStack_230;
  longlong lStack_228;
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  undefined4 local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined1 local_1a0 [16];
  undefined1 auStack_190 [16];
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  undefined4 local_168;
  undefined4 local_164;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined4 local_84;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  auVar6 = vpslldq_avx2(*in_RDI,0xe);
  auVar7 = vpsrldq_avx2(*in_RDI,2);
  local_ac0[0] = auVar6._0_8_;
  local_ac0[1] = auVar6._8_8_;
  local_ac0[2] = auVar6._16_8_;
  local_ac0[3] = auVar6._24_8_;
  local_260 = vpslldq_avx2(in_RDI[1],0xc);
  local_240 = local_ac0[0];
  lStack_238 = local_ac0[1];
  lStack_230 = local_ac0[2];
  lStack_228 = local_ac0[3];
  auVar6 = vpaddw_avx2(auVar6,local_260);
  local_ae0._0_8_ = auVar7._0_8_;
  local_ae0._8_8_ = auVar7._8_8_;
  local_ae0._16_8_ = auVar7._16_8_;
  local_ae0._24_8_ = auVar7._24_8_;
  local_2a0 = vpsrldq_avx2(in_RDI[1],4);
  local_280 = local_ae0._0_8_;
  uStack_278 = local_ae0._8_8_;
  uStack_270 = local_ae0._16_8_;
  uStack_268 = local_ae0._24_8_;
  auVar7 = vpaddw_avx2(auVar7,local_2a0);
  local_2c0 = *(undefined8 *)*in_RDI;
  uStack_2b8 = *(undefined8 *)(*in_RDI + 8);
  uStack_2b0 = *(undefined8 *)(*in_RDI + 0x10);
  uStack_2a8 = *(undefined8 *)(*in_RDI + 0x18);
  local_2e0 = *(undefined8 *)in_RDI[1];
  uStack_2d8 = *(undefined8 *)(in_RDI[1] + 8);
  uStack_2d0 = *(undefined8 *)(in_RDI[1] + 0x10);
  uStack_2c8 = *(undefined8 *)(in_RDI[1] + 0x18);
  auVar2 = vpaddw_avx2(*in_RDI,in_RDI[1]);
  auVar8 = vpslldq_avx2(auVar2,10);
  auVar9 = vpsrldq_avx2(auVar2,6);
  auVar10 = vpslldq_avx2(auVar2,4);
  auVar11 = vpsrldq_avx2(auVar2,0xc);
  local_ba0 = auVar2._0_8_;
  uVar4 = local_ba0;
  local_540 = local_ba0;
  local_ac0[0] = auVar6._0_8_;
  local_ac0[1] = auVar6._8_8_;
  local_ac0[2] = auVar6._16_8_;
  local_ac0[3] = auVar6._24_8_;
  local_320 = vpslldq_avx2(in_RDI[2],10);
  local_300 = local_ac0[0];
  lStack_2f8 = local_ac0[1];
  lStack_2f0 = local_ac0[2];
  lStack_2e8 = local_ac0[3];
  auVar6 = vpaddw_avx2(auVar6,local_320);
  local_ae0._0_8_ = auVar7._0_8_;
  local_ae0._8_8_ = auVar7._8_8_;
  local_ae0._16_8_ = auVar7._16_8_;
  local_ae0._24_8_ = auVar7._24_8_;
  local_360 = vpsrldq_avx2(in_RDI[2],6);
  local_340 = local_ae0._0_8_;
  uStack_338 = local_ae0._8_8_;
  uStack_330 = local_ae0._16_8_;
  uStack_328 = local_ae0._24_8_;
  auVar7 = vpaddw_avx2(auVar7,local_360);
  local_ac0[0] = auVar6._0_8_;
  local_ac0[1] = auVar6._8_8_;
  local_ac0[2] = auVar6._16_8_;
  local_ac0[3] = auVar6._24_8_;
  local_3a0 = vpslldq_avx2(in_RDI[3],8);
  local_380 = local_ac0[0];
  lStack_378 = local_ac0[1];
  lStack_370 = local_ac0[2];
  lStack_368 = local_ac0[3];
  auVar6 = vpaddw_avx2(auVar6,local_3a0);
  local_ae0._0_8_ = auVar7._0_8_;
  local_ae0._8_8_ = auVar7._8_8_;
  local_ae0._16_8_ = auVar7._16_8_;
  local_ae0._24_8_ = auVar7._24_8_;
  local_3e0 = vpsrldq_avx2(in_RDI[3],8);
  local_3c0 = local_ae0._0_8_;
  uStack_3b8 = local_ae0._8_8_;
  uStack_3b0 = local_ae0._16_8_;
  uStack_3a8 = local_ae0._24_8_;
  auVar7 = vpaddw_avx2(auVar7,local_3e0);
  local_400 = *(undefined8 *)in_RDI[2];
  uStack_3f8 = *(undefined8 *)(in_RDI[2] + 8);
  uStack_3f0 = *(undefined8 *)(in_RDI[2] + 0x10);
  uStack_3e8 = *(undefined8 *)(in_RDI[2] + 0x18);
  local_420 = *(undefined8 *)in_RDI[3];
  uStack_418 = *(undefined8 *)(in_RDI[3] + 8);
  uStack_410 = *(undefined8 *)(in_RDI[3] + 0x10);
  uStack_408 = *(undefined8 *)(in_RDI[3] + 0x18);
  auVar2 = vpaddw_avx2(in_RDI[2],in_RDI[3]);
  local_b00[0] = auVar8._0_8_;
  local_b00[1] = auVar8._8_8_;
  local_b00[2] = auVar8._16_8_;
  local_b00[3] = auVar8._24_8_;
  local_460 = vpslldq_avx2(auVar2,8);
  local_440 = local_b00[0];
  lStack_438 = local_b00[1];
  lStack_430 = local_b00[2];
  lStack_428 = local_b00[3];
  auVar8 = vpaddw_avx2(auVar8,local_460);
  local_b20 = auVar9._0_8_;
  uStack_b18 = auVar9._8_8_;
  uStack_b10 = auVar9._16_8_;
  uStack_b08 = auVar9._24_8_;
  local_4a0 = vpsrldq_avx2(auVar2,8);
  local_480 = local_b20;
  uStack_478 = uStack_b18;
  uStack_470 = uStack_b10;
  uStack_468 = uStack_b08;
  auVar9 = vpaddw_avx2(auVar9,local_4a0);
  local_b40 = auVar10._0_8_;
  uStack_b38 = auVar10._8_8_;
  uStack_b30 = auVar10._16_8_;
  uStack_b28 = auVar10._24_8_;
  local_4e0 = vpslldq_avx2(auVar2,6);
  local_4c0 = local_b40;
  uStack_4b8 = uStack_b38;
  uStack_4b0 = uStack_b30;
  uStack_4a8 = uStack_b28;
  auVar10 = vpaddw_avx2(auVar10,local_4e0);
  local_b60 = auVar11._0_8_;
  uStack_b58 = auVar11._8_8_;
  uStack_b50 = auVar11._16_8_;
  uStack_b48 = auVar11._24_8_;
  local_520 = vpsrldq_avx2(auVar2,10);
  local_500 = local_b60;
  uStack_4f8 = uStack_b58;
  uStack_4f0 = uStack_b50;
  uStack_4e8 = uStack_b48;
  auVar11 = vpaddw_avx2(auVar11,local_520);
  local_ba0 = auVar2._0_8_;
  uStack_b98 = auVar2._8_8_;
  uStack_b90 = auVar2._16_8_;
  uStack_b88 = auVar2._24_8_;
  local_560 = local_ba0;
  uStack_558 = uStack_b98;
  uStack_550 = uStack_b90;
  uStack_548 = uStack_b88;
  auVar3._8_8_ = uVar4;
  auVar3._0_8_ = uVar4;
  auVar3._16_8_ = uVar4;
  auVar3._24_8_ = uVar4;
  auVar2 = vpaddw_avx2(auVar3,auVar2);
  local_ac0[0] = auVar6._0_8_;
  local_ac0[1] = auVar6._8_8_;
  local_ac0[2] = auVar6._16_8_;
  local_ac0[3] = auVar6._24_8_;
  local_5a0 = vpslldq_avx2(in_RDI[4],6);
  local_580 = local_ac0[0];
  lStack_578 = local_ac0[1];
  lStack_570 = local_ac0[2];
  lStack_568 = local_ac0[3];
  auVar6 = vpaddw_avx2(auVar6,local_5a0);
  local_ae0._0_8_ = auVar7._0_8_;
  local_ae0._8_8_ = auVar7._8_8_;
  local_ae0._16_8_ = auVar7._16_8_;
  local_ae0._24_8_ = auVar7._24_8_;
  local_5e0 = vpsrldq_avx2(in_RDI[4],10);
  local_5c0 = local_ae0._0_8_;
  uStack_5b8 = local_ae0._8_8_;
  uStack_5b0 = local_ae0._16_8_;
  uStack_5a8 = local_ae0._24_8_;
  auVar7 = vpaddw_avx2(auVar7,local_5e0);
  local_ac0[0] = auVar6._0_8_;
  local_ac0[1] = auVar6._8_8_;
  local_ac0[2] = auVar6._16_8_;
  local_ac0[3] = auVar6._24_8_;
  local_620 = vpslldq_avx2(in_RDI[5],4);
  local_600 = local_ac0[0];
  lStack_5f8 = local_ac0[1];
  lStack_5f0 = local_ac0[2];
  lStack_5e8 = local_ac0[3];
  auVar6 = vpaddw_avx2(auVar6,local_620);
  local_ae0._0_8_ = auVar7._0_8_;
  local_ae0._8_8_ = auVar7._8_8_;
  local_ae0._16_8_ = auVar7._16_8_;
  local_ae0._24_8_ = auVar7._24_8_;
  local_660 = vpsrldq_avx2(in_RDI[5],0xc);
  local_640 = local_ae0._0_8_;
  uStack_638 = local_ae0._8_8_;
  uStack_630 = local_ae0._16_8_;
  uStack_628 = local_ae0._24_8_;
  auVar7 = vpaddw_avx2(auVar7,local_660);
  local_680 = *(undefined8 *)in_RDI[4];
  uStack_678 = *(undefined8 *)(in_RDI[4] + 8);
  uStack_670 = *(undefined8 *)(in_RDI[4] + 0x10);
  uStack_668 = *(undefined8 *)(in_RDI[4] + 0x18);
  local_6a0 = *(undefined8 *)in_RDI[5];
  uStack_698 = *(undefined8 *)(in_RDI[5] + 8);
  uStack_690 = *(undefined8 *)(in_RDI[5] + 0x10);
  uStack_688 = *(undefined8 *)(in_RDI[5] + 0x18);
  auVar3 = vpaddw_avx2(in_RDI[4],in_RDI[5]);
  local_b00[0] = auVar8._0_8_;
  local_b00[1] = auVar8._8_8_;
  local_b00[2] = auVar8._16_8_;
  local_b00[3] = auVar8._24_8_;
  local_6e0 = vpslldq_avx2(auVar3,6);
  local_6c0 = local_b00[0];
  lStack_6b8 = local_b00[1];
  lStack_6b0 = local_b00[2];
  lStack_6a8 = local_b00[3];
  auVar8 = vpaddw_avx2(auVar8,local_6e0);
  local_b20 = auVar9._0_8_;
  uStack_b18 = auVar9._8_8_;
  uStack_b10 = auVar9._16_8_;
  uStack_b08 = auVar9._24_8_;
  local_720 = vpsrldq_avx2(auVar3,10);
  local_700 = local_b20;
  uStack_6f8 = uStack_b18;
  uStack_6f0 = uStack_b10;
  uStack_6e8 = uStack_b08;
  auVar9 = vpaddw_avx2(auVar9,local_720);
  local_b40 = auVar10._0_8_;
  uStack_b38 = auVar10._8_8_;
  uStack_b30 = auVar10._16_8_;
  uStack_b28 = auVar10._24_8_;
  local_760 = vpslldq_avx2(auVar3,8);
  local_740 = local_b40;
  uStack_738 = uStack_b38;
  uStack_730 = uStack_b30;
  uStack_728 = uStack_b28;
  auVar10 = vpaddw_avx2(auVar10,local_760);
  local_b60 = auVar11._0_8_;
  uStack_b58 = auVar11._8_8_;
  uStack_b50 = auVar11._16_8_;
  uStack_b48 = auVar11._24_8_;
  local_7a0 = vpsrldq_avx2(auVar3,8);
  local_780 = local_b60;
  uStack_778 = uStack_b58;
  uStack_770 = uStack_b50;
  uStack_768 = uStack_b48;
  auVar11 = vpaddw_avx2(auVar11,local_7a0);
  local_b80 = auVar2._0_8_;
  uStack_b78 = auVar2._8_8_;
  uStack_b70 = auVar2._16_8_;
  uStack_b68 = auVar2._24_8_;
  local_ba0 = auVar3._0_8_;
  uStack_b98 = auVar3._8_8_;
  uStack_b90 = auVar3._16_8_;
  uStack_b88 = auVar3._24_8_;
  local_7c0 = local_b80;
  uStack_7b8 = uStack_b78;
  uStack_7b0 = uStack_b70;
  uStack_7a8 = uStack_b68;
  local_7e0 = local_ba0;
  uStack_7d8 = uStack_b98;
  uStack_7d0 = uStack_b90;
  uStack_7c8 = uStack_b88;
  auVar2 = vpaddw_avx2(auVar2,auVar3);
  local_ac0[0] = auVar6._0_8_;
  local_ac0[1] = auVar6._8_8_;
  local_ac0[2] = auVar6._16_8_;
  local_ac0[3] = auVar6._24_8_;
  local_820 = vpslldq_avx2(in_RDI[6],2);
  local_800 = local_ac0[0];
  lStack_7f8 = local_ac0[1];
  lStack_7f0 = local_ac0[2];
  lStack_7e8 = local_ac0[3];
  auVar6 = vpaddw_avx2(auVar6,local_820);
  local_ae0._0_8_ = auVar7._0_8_;
  local_ae0._8_8_ = auVar7._8_8_;
  local_ae0._16_8_ = auVar7._16_8_;
  local_ae0._24_8_ = auVar7._24_8_;
  local_860 = vpsrldq_avx2(in_RDI[6],0xe);
  local_840 = local_ae0._0_8_;
  uStack_838 = local_ae0._8_8_;
  uStack_830 = local_ae0._16_8_;
  uStack_828 = local_ae0._24_8_;
  local_ae0 = vpaddw_avx2(auVar7,local_860);
  local_ac0[0] = auVar6._0_8_;
  local_ac0[1] = auVar6._8_8_;
  local_ac0[2] = auVar6._16_8_;
  local_ac0[3] = auVar6._24_8_;
  local_8a0 = *(undefined8 *)in_RDI[7];
  uStack_898 = *(undefined8 *)(in_RDI[7] + 8);
  uStack_890 = *(undefined8 *)(in_RDI[7] + 0x10);
  uStack_888 = *(undefined8 *)(in_RDI[7] + 0x18);
  local_880 = local_ac0[0];
  lStack_878 = local_ac0[1];
  lStack_870 = local_ac0[2];
  lStack_868 = local_ac0[3];
  local_ac0 = (__m256i)vpaddw_avx2(auVar6,in_RDI[7]);
  local_8c0 = *(undefined8 *)in_RDI[6];
  uStack_8b8 = *(undefined8 *)(in_RDI[6] + 8);
  uStack_8b0 = *(undefined8 *)(in_RDI[6] + 0x10);
  uStack_8a8 = *(undefined8 *)(in_RDI[6] + 0x18);
  local_8e0 = *(undefined8 *)in_RDI[7];
  uStack_8d8 = *(undefined8 *)(in_RDI[7] + 8);
  uStack_8d0 = *(undefined8 *)(in_RDI[7] + 0x10);
  uStack_8c8 = *(undefined8 *)(in_RDI[7] + 0x18);
  auVar6 = vpaddw_avx2(in_RDI[6],in_RDI[7]);
  local_b00[0] = auVar8._0_8_;
  local_b00[1] = auVar8._8_8_;
  local_b00[2] = auVar8._16_8_;
  local_b00[3] = auVar8._24_8_;
  local_920 = vpslldq_avx2(auVar6,4);
  local_900 = local_b00[0];
  lStack_8f8 = local_b00[1];
  lStack_8f0 = local_b00[2];
  lStack_8e8 = local_b00[3];
  local_b00 = (__m256i)vpaddw_avx2(auVar8,local_920);
  local_b20 = auVar9._0_8_;
  uStack_b18 = auVar9._8_8_;
  uStack_b10 = auVar9._16_8_;
  uStack_b08 = auVar9._24_8_;
  local_960 = vpsrldq_avx2(auVar6,0xc);
  local_940 = local_b20;
  uStack_938 = uStack_b18;
  uStack_930 = uStack_b10;
  uStack_928 = uStack_b08;
  vpaddw_avx2(auVar9,local_960);
  local_b40 = auVar10._0_8_;
  uStack_b38 = auVar10._8_8_;
  uStack_b30 = auVar10._16_8_;
  uStack_b28 = auVar10._24_8_;
  local_9a0 = vpslldq_avx2(auVar6,10);
  local_980 = local_b40;
  uStack_978 = uStack_b38;
  uStack_970 = uStack_b30;
  uStack_968 = uStack_b28;
  vpaddw_avx2(auVar10,local_9a0);
  local_b60 = auVar11._0_8_;
  uStack_b58 = auVar11._8_8_;
  uStack_b50 = auVar11._16_8_;
  uStack_b48 = auVar11._24_8_;
  local_9e0 = vpsrldq_avx2(auVar6,6);
  local_9c0 = local_b60;
  uStack_9b8 = uStack_b58;
  uStack_9b0 = uStack_b50;
  uStack_9a8 = uStack_b48;
  vpaddw_avx2(auVar11,local_9e0);
  local_b80 = auVar2._0_8_;
  uStack_b78 = auVar2._8_8_;
  uStack_b70 = auVar2._16_8_;
  uStack_b68 = auVar2._24_8_;
  local_ba0 = auVar6._0_8_;
  uStack_b98 = auVar6._8_8_;
  uStack_b90 = auVar6._16_8_;
  uStack_b88 = auVar6._24_8_;
  local_a00 = local_b80;
  uStack_9f8 = uStack_b78;
  uStack_9f0 = uStack_b70;
  uStack_9e8 = uStack_b68;
  local_a20 = local_ba0;
  uStack_a18 = uStack_b98;
  uStack_a10 = uStack_b90;
  uStack_a08 = uStack_b88;
  auVar6 = vpaddw_avx2(auVar2,auVar6);
  local_124 = 0xd2;
  local_128 = 0x118;
  local_12c = 0x1a4;
  local_130 = 0x348;
  local_134 = 0xd2;
  local_138 = 0x118;
  local_13c = 0x1a4;
  local_140 = 0x348;
  auVar1 = vpinsrd_avx(ZEXT416(0x348),0x1a4,1);
  auVar1 = vpinsrd_avx(auVar1,0x118,2);
  local_160 = vpinsrd_avx(auVar1,0xd2,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x348),0x1a4,1);
  auVar1 = vpinsrd_avx(auVar1,0x118,2);
  auStack_150 = vpinsrd_avx(auVar1,0xd2,3);
  local_164 = 0x69;
  local_168 = 0x78;
  local_16c = 0x8c;
  local_170 = 0xa8;
  local_174 = 0x69;
  local_178 = 0x78;
  local_17c = 0x8c;
  local_180 = 0xa8;
  auVar1 = vpinsrd_avx(ZEXT416(0xa8),0x8c,1);
  auVar1 = vpinsrd_avx(auVar1,0x78,2);
  local_1a0 = vpinsrd_avx(auVar1,0x69,3);
  auVar1 = vpinsrd_avx(ZEXT416(0xa8),0x8c,1);
  auVar1 = vpinsrd_avx(auVar1,0x78,2);
  auStack_190 = vpinsrd_avx(auVar1,0x69,3);
  local_1a4 = 0xd2;
  local_1a8 = 0x1a4;
  local_1ac = 0;
  local_1b0 = 0;
  local_1b4 = 0xd2;
  local_1b8 = 0x1a4;
  local_1bc = 0;
  local_1c0 = 0;
  auVar1 = vpinsrd_avx(ZEXT416(0),0,1);
  auVar1 = vpinsrd_avx(auVar1,0x1a4,2);
  local_1e0 = vpinsrd_avx(auVar1,0xd2,3);
  auVar1 = vpinsrd_avx(ZEXT416(0),0,1);
  auVar1 = vpinsrd_avx(auVar1,0x1a4,2);
  auStack_1d0 = vpinsrd_avx(auVar1,0xd2,3);
  local_c00 = local_1e0._0_8_;
  lStack_bf8 = local_1e0._8_8_;
  lStack_bf0 = auStack_1d0._0_8_;
  local_1e4 = 0x69;
  local_1e8 = 0x69;
  local_1ec = 0x69;
  local_1f0 = 0x8c;
  local_1f4 = 0x69;
  local_1f8 = 0x69;
  local_1fc = 0x69;
  local_200 = 0x8c;
  auVar1 = vpinsrd_avx(ZEXT416(0x8c),0x69,1);
  auVar1 = vpinsrd_avx(auVar1,0x69,2);
  local_220 = vpinsrd_avx(auVar1,0x69,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x8c),0x69,1);
  auVar1 = vpinsrd_avx(auVar1,0x69,2);
  auStack_210 = vpinsrd_avx(auVar1,0x69,3);
  local_c20 = local_220._0_8_;
  lStack_c18 = local_220._8_8_;
  lStack_c10 = auStack_210._0_8_;
  lStack_c08 = auStack_210._8_8_;
  partialb = &local_ac0;
  lVar5 = local_220._0_8_;
  lVar12 = local_220._8_8_;
  lVar13 = auStack_210._0_8_;
  lVar14 = auStack_210._8_8_;
  x3 = (__m256i *)auStack_1d0._8_8_;
  x2 = (__m256i *)local_1a0._0_8_;
  x1 = (__m256i *)local_1a0._8_8_;
  x0 = (__m256i *)auStack_190._0_8_;
  local_a98 = in_RDX;
  local_a90 = in_RSI;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  fold_mul_and_sum_avx2
            (in_stack_fffffffffffff3d0,partialb,in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8)
  ;
  local_ac0[1] = lVar12;
  local_ac0[0] = lVar5;
  local_ac0[2] = lVar13;
  local_ac0[3] = lVar14;
  const2 = (__m256i *)&local_c00;
  const1 = (__m256i *)&local_c20;
  fold_mul_and_sum_avx2(in_stack_fffffffffffff3d0,partialb,const1,const2);
  fold_mul_and_sum_avx2(&local_b00,partialb,const1,const2);
  local_b00[1] = lVar12;
  local_b00[0] = lVar5;
  local_b00[2] = lVar13;
  local_b00[3] = lVar14;
  local_b80 = auVar6._0_8_;
  uStack_b78 = auVar6._8_8_;
  uStack_b70 = auVar6._16_8_;
  uStack_b68 = auVar6._24_8_;
  local_100 = local_b80;
  uStack_f8 = uStack_b78;
  uStack_f0 = uStack_b70;
  uStack_e8 = uStack_b68;
  local_120 = local_b80;
  uStack_118 = uStack_b78;
  uStack_110 = uStack_b70;
  uStack_108 = uStack_b68;
  auVar6 = vpmaddwd_avx2(auVar6,auVar6);
  local_b80 = auVar6._0_8_;
  uStack_b78 = auVar6._8_8_;
  uStack_b70 = auVar6._16_8_;
  uStack_b68 = auVar6._24_8_;
  local_84 = 0x69;
  local_34 = 0x69;
  local_38 = 0x69;
  local_3c = 0x69;
  local_40 = 0x69;
  local_44 = 0x69;
  local_48 = 0x69;
  local_4c = 0x69;
  local_50 = 0x69;
  auVar1 = vpinsrd_avx(ZEXT416(0x69),0x69,1);
  auVar1 = vpinsrd_avx(auVar1,0x69,2);
  local_80 = vpinsrd_avx(auVar1,0x69,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x69),0x69,1);
  auVar1 = vpinsrd_avx(auVar1,0x69,2);
  auStack_70 = vpinsrd_avx(auVar1,0x69,3);
  local_c0 = local_b80;
  uStack_b8 = uStack_b78;
  uStack_b0 = uStack_b70;
  uStack_a8 = uStack_b68;
  local_e0 = local_80._0_8_;
  uStack_d8 = local_80._8_8_;
  uStack_d0 = auStack_70._0_8_;
  uStack_c8 = auStack_70._8_8_;
  auVar7._16_8_ = auStack_70._0_8_;
  auVar7._0_16_ = local_80;
  auVar7._24_8_ = auStack_70._8_8_;
  auVar6 = vpmulld_avx2(auVar6,auVar7);
  hsum4_avx2(x0,x1,x2,x3);
  local_ac0[0] = auVar6._0_8_;
  local_ac0[1] = auVar6._8_8_;
  *local_a90 = local_ac0[0];
  local_a90[1] = local_ac0[1];
  local_ac0[2] = auVar6._16_8_;
  local_ac0[3] = auVar6._24_8_;
  (*local_a98)[0] = local_ac0[2];
  (*local_a98)[1] = local_ac0[3];
  return local_a98;
}

Assistant:

static inline __m256i compute_directions_avx2(__m256i *lines,
                                              int32_t cost_frist_8x8[4],
                                              int32_t cost_second_8x8[4]) {
  __m256i partial4a, partial4b, partial5a, partial5b, partial7a, partial7b;
  __m256i partial6;
  __m256i tmp;
  /* Partial sums for lines 0 and 1. */
  partial4a = _mm256_slli_si256(lines[0], 14);
  partial4b = _mm256_srli_si256(lines[0], 2);
  partial4a = _mm256_add_epi16(partial4a, _mm256_slli_si256(lines[1], 12));
  partial4b = _mm256_add_epi16(partial4b, _mm256_srli_si256(lines[1], 4));
  tmp = _mm256_add_epi16(lines[0], lines[1]);
  partial5a = _mm256_slli_si256(tmp, 10);
  partial5b = _mm256_srli_si256(tmp, 6);
  partial7a = _mm256_slli_si256(tmp, 4);
  partial7b = _mm256_srli_si256(tmp, 12);
  partial6 = tmp;

  /* Partial sums for lines 2 and 3. */
  partial4a = _mm256_add_epi16(partial4a, _mm256_slli_si256(lines[2], 10));
  partial4b = _mm256_add_epi16(partial4b, _mm256_srli_si256(lines[2], 6));
  partial4a = _mm256_add_epi16(partial4a, _mm256_slli_si256(lines[3], 8));
  partial4b = _mm256_add_epi16(partial4b, _mm256_srli_si256(lines[3], 8));
  tmp = _mm256_add_epi16(lines[2], lines[3]);
  partial5a = _mm256_add_epi16(partial5a, _mm256_slli_si256(tmp, 8));
  partial5b = _mm256_add_epi16(partial5b, _mm256_srli_si256(tmp, 8));
  partial7a = _mm256_add_epi16(partial7a, _mm256_slli_si256(tmp, 6));
  partial7b = _mm256_add_epi16(partial7b, _mm256_srli_si256(tmp, 10));
  partial6 = _mm256_add_epi16(partial6, tmp);

  /* Partial sums for lines 4 and 5. */
  partial4a = _mm256_add_epi16(partial4a, _mm256_slli_si256(lines[4], 6));
  partial4b = _mm256_add_epi16(partial4b, _mm256_srli_si256(lines[4], 10));
  partial4a = _mm256_add_epi16(partial4a, _mm256_slli_si256(lines[5], 4));
  partial4b = _mm256_add_epi16(partial4b, _mm256_srli_si256(lines[5], 12));
  tmp = _mm256_add_epi16(lines[4], lines[5]);
  partial5a = _mm256_add_epi16(partial5a, _mm256_slli_si256(tmp, 6));
  partial5b = _mm256_add_epi16(partial5b, _mm256_srli_si256(tmp, 10));
  partial7a = _mm256_add_epi16(partial7a, _mm256_slli_si256(tmp, 8));
  partial7b = _mm256_add_epi16(partial7b, _mm256_srli_si256(tmp, 8));
  partial6 = _mm256_add_epi16(partial6, tmp);

  /* Partial sums for lines 6 and 7. */
  partial4a = _mm256_add_epi16(partial4a, _mm256_slli_si256(lines[6], 2));
  partial4b = _mm256_add_epi16(partial4b, _mm256_srli_si256(lines[6], 14));
  partial4a = _mm256_add_epi16(partial4a, lines[7]);
  tmp = _mm256_add_epi16(lines[6], lines[7]);
  partial5a = _mm256_add_epi16(partial5a, _mm256_slli_si256(tmp, 4));
  partial5b = _mm256_add_epi16(partial5b, _mm256_srli_si256(tmp, 12));
  partial7a = _mm256_add_epi16(partial7a, _mm256_slli_si256(tmp, 10));
  partial7b = _mm256_add_epi16(partial7b, _mm256_srli_si256(tmp, 6));
  partial6 = _mm256_add_epi16(partial6, tmp);

  const __m256i const_reg_1 =
      _mm256_set_epi32(210, 280, 420, 840, 210, 280, 420, 840);
  const __m256i const_reg_2 =
      _mm256_set_epi32(105, 120, 140, 168, 105, 120, 140, 168);
  const __m256i const_reg_3 = _mm256_set_epi32(210, 420, 0, 0, 210, 420, 0, 0);
  const __m256i const_reg_4 =
      _mm256_set_epi32(105, 105, 105, 140, 105, 105, 105, 140);

  /* Compute costs in terms of partial sums. */
  partial4a =
      fold_mul_and_sum_avx2(&partial4a, &partial4b, &const_reg_1, &const_reg_2);
  partial7a =
      fold_mul_and_sum_avx2(&partial7a, &partial7b, &const_reg_3, &const_reg_4);
  partial5a =
      fold_mul_and_sum_avx2(&partial5a, &partial5b, &const_reg_3, &const_reg_4);
  partial6 = _mm256_madd_epi16(partial6, partial6);
  partial6 = _mm256_mullo_epi32(partial6, _mm256_set1_epi32(105));

  partial4a = hsum4_avx2(&partial4a, &partial5a, &partial6, &partial7a);
  _mm_storeu_si128((__m128i *)cost_frist_8x8,
                   _mm256_castsi256_si128(partial4a));
  _mm_storeu_si128((__m128i *)cost_second_8x8,
                   _mm256_extractf128_si256(partial4a, 1));

  return partial4a;
}